

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_mutex_group_usage_set_metavar(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *s;
  int d;
  int c;
  int b;
  int a;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&b,0,"program");
  if (iVar1 == 0) {
    cargo._4_4_ = _test_mutex_group_usage_add_options
                            (_b,CARGO_MUTEXGRP_GROUP_USAGE|CARGO_MUTEXGRP_ONE_REQUIRED,
                             CARGO_MUTEXGRP_RAW_DESCRIPTION|CARGO_MUTEXGRP_GROUP_USAGE,&c,&d,
                             (int *)((long)&s + 4),(int *)&s);
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_mutex_group_set_metavar(_b,"mgroup1","MUTEX");
      if (cargo._4_4_ == 0) {
        cargo_print_usage(_b,CARGO_USAGE_FULL);
        pcVar2 = cargo_get_usage(_b,CARGO_USAGE_SHORT);
        if (pcVar2 == (char *)0x0) {
          pcStack_18 = "Got NULL short usage";
        }
        else {
          pcVar3 = strstr(pcVar2,"MUTEX");
          if (pcVar3 == (char *)0x0) {
            pcStack_18 = "Expected to find mutex group metavar";
          }
          else {
            pcVar3 = strstr(pcVar2,"--beta");
            if (pcVar3 == (char *)0x0) {
              pcVar2 = strstr(pcVar2,"--centauri");
              if (pcVar2 == (char *)0x0) {
                cargo._4_4_ = cargo_mutex_group_set_metavar(_b,"mgroup3","MUTEX");
                if (cargo._4_4_ == 0) {
                  pcStack_18 = "Succeeded to set metavar on invalid mutex group";
                }
              }
              else {
                pcStack_18 = "--centauri should be hidden";
              }
            }
            else {
              pcStack_18 = "--beta should be hidden";
            }
          }
        }
      }
      else {
        pcStack_18 = "Failed to set mutex group metavar";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
    cargo_destroy((cargo_t *)&b);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_mutex_group_usage_set_metavar)
{
    int a;
    int b;
    int c;
    int d;
    const char *s = NULL;

    ret = _test_mutex_group_usage_add_options(cargo,
            CARGO_MUTEXGRP_ONE_REQUIRED |
            CARGO_MUTEXGRP_GROUP_USAGE,
            CARGO_MUTEXGRP_GROUP_USAGE |
            CARGO_MUTEXGRP_RAW_DESCRIPTION, &a, &b, &c, &d);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_mutex_group_set_metavar(cargo, "mgroup1", "MUTEX");
    cargo_assert(ret == 0, "Failed to set mutex group metavar");

    cargo_print_usage(cargo, 0);

    s = cargo_get_usage(cargo, CARGO_USAGE_SHORT);
    cargo_assert(s, "Got NULL short usage");
    cargo_assert(strstr(s, "MUTEX"), "Expected to find mutex group metavar");
    cargo_assert(!strstr(s, "--beta"), "--beta should be hidden");
    cargo_assert(!strstr(s, "--centauri"), "--centauri should be hidden");

    // Try to set for non-existing mutex group.
    ret = cargo_mutex_group_set_metavar(cargo, "mgroup3", "MUTEX");
    cargo_assert(ret != 0, "Succeeded to set metavar on invalid mutex group");

    _TEST_CLEANUP();
}